

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::
    reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,bool post_process,
              float coeff,int keepdims,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  Mat *pMVar11;
  Mat *pMVar12;
  bool bVar13;
  long lVar14;
  Mat *pMVar15;
  bool bVar16;
  uint7 in_register_00000011;
  int iVar17;
  Mat *pMVar18;
  byte bVar19;
  Mat *pMVar20;
  uint uVar21;
  undefined7 in_register_00000089;
  ulong uVar22;
  void *pvVar23;
  void *pvVar24;
  ulong uVar25;
  uint uVar26;
  int unaff_R14D;
  long lVar27;
  float fVar28;
  undefined4 in_stack_0000000c;
  Mat sums;
  Mat local_88;
  Mat *local_38;
  
  lVar14 = CONCAT44(in_stack_0000000c,keepdims);
  sVar2 = a->elemsize;
  iVar17 = a->dims;
  pMVar20 = b;
  if ((int)CONCAT71(in_register_00000089,post_process) == 0) {
    if (iVar17 == 2) {
      uVar9 = a->w;
      pMVar15 = (Mat *)(ulong)uVar9;
      uVar8 = a->h;
      pMVar11 = (Mat *)(ulong)uVar8;
      bVar16 = !reduce_w;
      if (!bVar16 && reduce_h) {
        local_38 = a;
        Mat::create(b,1,sVar2,*(Allocator **)(lVar14 + 8));
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        pMVar20 = pMVar11;
        Mat::create(&local_88,uVar8,sVar2,*(Allocator **)(lVar14 + 0x10));
        a = local_38;
        unaff_R14D = -100;
        if (((Mat *)local_88.data != (Mat *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
          if ((int)uVar8 < 1) {
LAB_0021128d:
            fVar28 = 0.0;
          }
          else {
            pvVar10 = local_38->data;
            iVar1 = local_38->w;
            sVar3 = local_38->elemsize;
            pMVar20 = (Mat *)0x0;
            do {
              fVar28 = 0.0;
              if (0 < (int)uVar9) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar28 = fVar28 + ABS(*(float *)((long)pvVar10 + (long)pMVar12 * 4));
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar15 != pMVar12);
              }
              *(float *)((long)(void **)local_88.data + (long)pMVar20 * 4) = fVar28;
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar10 = (void *)((long)pvVar10 + (long)iVar1 * sVar3);
            } while (pMVar20 != pMVar11);
            if ((int)uVar8 < 1) goto LAB_0021128d;
            fVar28 = 0.0;
            pMVar15 = (Mat *)0x0;
            do {
              fVar28 = fVar28 + *(float *)((long)(void **)local_88.data + (long)pMVar15 * 4);
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
            } while (pMVar11 != pMVar15);
          }
          *(float *)b->data = fVar28;
          unaff_R14D = 0;
        }
        lVar14 = CONCAT44(in_stack_0000000c,keepdims);
        piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pMVar20 = (Mat *)local_88.data;
            if (local_88.allocator == (Allocator *)0x0) {
              if ((Mat *)local_88.data != (Mat *)0x0) {
                free(local_88.data);
                lVar14 = CONCAT44(in_stack_0000000c,keepdims);
              }
            }
            else {
              (*(local_88.allocator)->_vptr_Allocator[3])();
              lVar14 = CONCAT44(in_stack_0000000c,keepdims);
            }
          }
        }
        bVar16 = false;
      }
      else {
        pMVar20 = (Mat *)(CONCAT71(in_register_00000011,bVar16 || reduce_h) & 0xffffffff);
        if (bVar16 || reduce_h) {
          if (reduce_h && !reduce_w) {
            pMVar20 = pMVar15;
            Mat::create(b,uVar9,sVar2,*(Allocator **)(lVar14 + 8));
            uVar21 = b->c * (int)b->cstep;
            if (0 < (int)uVar21) {
              pMVar20 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar21 << 2);
            }
            lVar14 = CONCAT44(in_stack_0000000c,keepdims);
            if (0 < (int)uVar8) {
              iVar1 = a->w;
              sVar3 = a->elemsize;
              pvVar10 = a->data;
              pvVar24 = b->data;
              pMVar20 = (Mat *)0x0;
              do {
                if (0 < (int)uVar9) {
                  pMVar12 = (Mat *)0x0;
                  do {
                    *(float *)((long)pvVar24 + (long)pMVar12 * 4) =
                         ABS(*(float *)((long)pvVar10 + (long)pMVar12 * 4)) +
                         *(float *)((long)pvVar24 + (long)pMVar12 * 4);
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                  } while (pMVar15 != pMVar12);
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                pvVar10 = (void *)((long)pvVar10 + (long)iVar1 * sVar3);
              } while (pMVar20 != pMVar11);
            }
LAB_00211283:
            bVar16 = false;
            unaff_R14D = 0;
          }
          else {
            bVar16 = true;
          }
        }
        else {
          pMVar20 = pMVar11;
          Mat::create(b,uVar8,sVar2,*(Allocator **)(lVar14 + 8));
          if (0 < (int)uVar8) {
            iVar1 = a->w;
            sVar3 = a->elemsize;
            pvVar10 = a->data;
            pvVar24 = b->data;
            pMVar20 = (Mat *)0x0;
            lVar14 = CONCAT44(in_stack_0000000c,keepdims);
            do {
              fVar28 = 0.0;
              if (0 < (int)uVar9) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar28 = fVar28 + ABS(*(float *)((long)pvVar10 + (long)pMVar12 * 4));
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar15 != pMVar12);
              }
              *(float *)((long)pvVar24 + (long)pMVar20 * 4) = fVar28;
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar10 = (void *)((long)pvVar10 + (long)iVar1 * sVar3);
            } while (pMVar20 != pMVar11);
            goto LAB_00211283;
          }
          bVar16 = false;
          unaff_R14D = 0;
          lVar14 = CONCAT44(in_stack_0000000c,keepdims);
        }
      }
      in_register_00000011 = in_register_00000011 & 0xffffff;
      if (!bVar16) goto LAB_00212249;
    }
    else if (iVar17 == 1) {
      iVar17 = a->w;
      pMVar20 = (Mat *)0x1;
      Mat::create(b,1,sVar2,*(Allocator **)(lVar14 + 8));
      if ((long)iVar17 < 1) goto LAB_00210caa;
      fVar28 = 0.0;
      lVar14 = 0;
      do {
        fVar28 = fVar28 + ABS(*(float *)((long)a->data + lVar14 * 4));
        lVar14 = lVar14 + 1;
      } while (iVar17 != lVar14);
      goto LAB_00210cad;
    }
    if (iVar17 == 3) {
      uVar9 = a->w;
      lVar27 = (long)(int)uVar9;
      uVar8 = a->h;
      uVar22 = (ulong)uVar8;
      uVar21 = a->c;
      pMVar15 = (Mat *)(ulong)uVar21;
      uVar26 = uVar8 * uVar9;
      bVar16 = !reduce_w;
      bVar7 = !reduce_h;
      bVar13 = !reduce_c;
      pMVar20 = pMVar15;
      if ((bVar16 || bVar7) || bVar13) {
        if ((bVar16 || bVar7) || reduce_c) {
          pMVar11 = (Mat *)(ulong)uVar9;
          uVar25 = CONCAT71(in_register_00000011,bVar16 || reduce_h) & 0xffffffff;
          bVar19 = (byte)uVar25 | reduce_c;
          pMVar20 = (Mat *)CONCAT71((int7)(uVar25 >> 8),bVar19);
          if (bVar19 == 0) {
            pMVar20 = (Mat *)(ulong)uVar8;
            Mat::create(b,uVar8,uVar21,sVar2,*(Allocator **)(lVar14 + 8));
            if (0 < (int)uVar21) {
              pvVar10 = a->data;
              sVar2 = a->elemsize;
              pvVar24 = b->data;
              pMVar20 = (Mat *)((long)b->w * b->elemsize);
              sVar3 = a->cstep;
              pMVar12 = (Mat *)0x0;
              do {
                if (0 < (int)uVar8) {
                  uVar25 = 0;
                  pvVar23 = pvVar10;
                  do {
                    fVar28 = 0.0;
                    if (0 < (int)uVar9) {
                      pMVar18 = (Mat *)0x0;
                      do {
                        fVar28 = fVar28 + ABS(*(float *)((long)pvVar23 + (long)pMVar18 * 4));
                        pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                      } while (pMVar11 != pMVar18);
                    }
                    *(float *)((long)pvVar24 + uVar25 * 4 + (long)pMVar20 * (long)pMVar12) = fVar28;
                    uVar25 = uVar25 + 1;
                    pvVar23 = (void *)((long)pvVar23 + lVar27 * 4);
                  } while (uVar25 != uVar22);
                }
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
              } while (pMVar12 != pMVar15);
              goto LAB_00211cf3;
            }
LAB_00211cfe:
            unaff_R14D = 0;
          }
          else {
            if ((bVar16 || reduce_h) || bVar13) {
              if ((bVar7 || reduce_w) || bVar13) {
                if ((reduce_w || reduce_h) || bVar13) {
                  bVar16 = true;
                  if ((!bVar7 && !reduce_w) && !reduce_c) {
                    pMVar20 = pMVar11;
                    Mat::create(b,uVar9,uVar21,sVar2,*(Allocator **)(lVar14 + 8));
                    uVar26 = b->c * (int)b->cstep;
                    if (0 < (int)uVar26) {
                      pMVar20 = (Mat *)0x0;
                      memset(b->data,0,(ulong)uVar26 << 2);
                    }
                    if ((int)uVar21 < 1) goto LAB_00211cfe;
                    pvVar10 = a->data;
                    sVar2 = a->elemsize;
                    pvVar24 = b->data;
                    sVar3 = a->cstep;
                    pMVar20 = (Mat *)((long)b->w * b->elemsize);
                    pMVar12 = (Mat *)0x0;
                    unaff_R14D = 0;
                    do {
                      if (0 < (int)uVar8) {
                        uVar21 = 0;
                        pvVar23 = pvVar10;
                        do {
                          if (0 < (int)uVar9) {
                            pMVar18 = (Mat *)0x0;
                            do {
                              *(float *)((long)pvVar24 + (long)pMVar18 * 4) =
                                   ABS(*(float *)((long)pvVar23 + (long)pMVar18 * 4)) +
                                   *(float *)((long)pvVar24 + (long)pMVar18 * 4);
                              pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                            } while (pMVar11 != pMVar18);
                          }
                          uVar21 = uVar21 + 1;
                          pvVar23 = (void *)((long)pvVar23 + (long)(int)uVar9 * 4);
                        } while (uVar21 != uVar8);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
                      pvVar24 = (void *)((long)&pMVar20->data + (long)pvVar24);
                      bVar16 = false;
                    } while (pMVar12 != pMVar15);
                  }
                }
                else {
                  Mat::create(b,uVar9,uVar8,sVar2,*(Allocator **)(lVar14 + 8));
                  uVar9 = b->c * (int)b->cstep;
                  if (0 < (int)uVar9) {
                    pMVar11 = (Mat *)0x0;
                    memset(b->data,0,(ulong)uVar9 << 2);
                  }
                  pMVar20 = pMVar11;
                  if ((int)uVar21 < 1) goto LAB_00211cf3;
                  pvVar10 = a->data;
                  sVar2 = a->elemsize;
                  sVar3 = a->cstep;
                  pvVar24 = b->data;
                  pMVar20 = (Mat *)(ulong)uVar26;
                  pMVar11 = (Mat *)0x0;
                  unaff_R14D = 0;
                  do {
                    if (0 < (int)uVar26) {
                      pMVar12 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar24 + (long)pMVar12 * 4) =
                             ABS(*(float *)((long)pvVar10 + (long)pMVar12 * 4)) +
                             *(float *)((long)pvVar24 + (long)pMVar12 * 4);
                        pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      } while (pMVar20 != pMVar12);
                    }
                    pMVar11 = (Mat *)((long)&pMVar11->data + 1);
                    pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
                    bVar16 = false;
                  } while (pMVar11 != pMVar15);
                }
                goto LAB_0021223f;
              }
              Mat::create(b,uVar9,sVar2,*(Allocator **)(lVar14 + 8));
              local_88.cstep = 0;
              local_88.data = (Mat *)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88.elemsize._4_4_ = 0;
              local_88.elempack = 0;
              local_88.allocator = (Allocator *)0x0;
              local_88.dims = 0;
              local_88.w = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              pMVar20 = (Mat *)(ulong)uVar9;
              Mat::create(&local_88,uVar9,1,uVar21,sVar2,*(Allocator **)(lVar14 + 0x10));
              unaff_R14D = -100;
              if (((Mat *)local_88.data != (Mat *)0x0) && (local_88.cstep * (long)local_88.c != 0))
              {
                uVar26 = (int)local_88.cstep * local_88.c;
                if (0 < (int)uVar26) {
                  pMVar20 = (Mat *)0x0;
                  memset(local_88.data,0,(ulong)uVar26 << 2);
                }
                if (0 < (int)uVar21) {
                  pvVar10 = a->data;
                  sVar2 = a->elemsize;
                  sVar3 = a->cstep;
                  pMVar12 = (Mat *)0x0;
                  pMVar20 = (Mat *)local_88.data;
                  do {
                    if (0 < (int)uVar8) {
                      uVar26 = 0;
                      pvVar24 = pvVar10;
                      do {
                        if (0 < (int)uVar9) {
                          pMVar18 = (Mat *)0x0;
                          do {
                            *(float *)((long)&pMVar20->data + (long)pMVar18 * 4) =
                                 ABS(*(float *)((long)pvVar24 + (long)pMVar18 * 4)) +
                                 *(float *)((long)&pMVar20->data + (long)pMVar18 * 4);
                            pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                          } while (pMVar11 != pMVar18);
                        }
                        uVar26 = uVar26 + 1;
                        pvVar24 = (void *)((long)pvVar24 + lVar27 * 4);
                      } while (uVar26 != uVar8);
                    }
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
                    pMVar20 = (Mat *)((long)&pMVar20->data +
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     * local_88.cstep);
                  } while (pMVar12 != pMVar15);
                }
                uVar8 = b->c * (int)b->cstep;
                if (0 < (int)uVar8) {
                  pMVar20 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar8 << 2);
                }
                if (0 < (int)uVar21) {
                  pvVar10 = b->data;
                  pMVar20 = (Mat *)0x0;
                  pMVar12 = (Mat *)local_88.data;
                  do {
                    if (0 < (int)uVar9) {
                      pMVar18 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar10 + (long)pMVar18 * 4) =
                             *(float *)((long)&pMVar12->data + (long)pMVar18 * 4) +
                             *(float *)((long)pvVar10 + (long)pMVar18 * 4);
                        pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                      } while (pMVar11 != pMVar18);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pMVar12 = (Mat *)((long)&pMVar12->data +
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     * local_88.cstep);
                  } while (pMVar20 != pMVar15);
                }
                goto LAB_00212226;
              }
            }
            else {
              Mat::create(b,uVar8,sVar2,*(Allocator **)(lVar14 + 8));
              local_88.cstep = 0;
              local_88.data = (Mat *)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88.elemsize._4_4_ = 0;
              local_88.elempack = 0;
              local_88.allocator = (Allocator *)0x0;
              local_88.dims = 0;
              local_88.w = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              pMVar20 = (Mat *)0x1;
              Mat::create(&local_88,1,uVar8,uVar21,sVar2,*(Allocator **)(lVar14 + 0x10));
              unaff_R14D = -100;
              if (((Mat *)local_88.data != (Mat *)0x0) && (local_88.cstep * (long)local_88.c != 0))
              {
                uVar26 = (int)local_88.cstep * local_88.c;
                if (0 < (int)uVar26) {
                  pMVar20 = (Mat *)0x0;
                  memset(local_88.data,0,(ulong)uVar26 << 2);
                }
                if (0 < (int)uVar21) {
                  pvVar10 = a->data;
                  sVar2 = a->elemsize;
                  pMVar20 = (Mat *)(CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                   * local_88.cstep);
                  sVar3 = a->cstep;
                  pMVar12 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar8) {
                      uVar25 = 0;
                      pvVar24 = pvVar10;
                      do {
                        fVar28 = 0.0;
                        if (0 < (int)uVar9) {
                          pMVar18 = (Mat *)0x0;
                          do {
                            fVar28 = fVar28 + ABS(*(float *)((long)pvVar24 + (long)pMVar18 * 4));
                            pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                          } while (pMVar11 != pMVar18);
                        }
                        *(float *)((long)(void **)local_88.data +
                                  uVar25 * 4 + (long)pMVar20 * (long)pMVar12) = fVar28;
                        uVar25 = uVar25 + 1;
                        pvVar24 = (void *)((long)pvVar24 + lVar27 * 4);
                      } while (uVar25 != uVar22);
                    }
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
                  } while (pMVar12 != pMVar15);
                }
                uVar9 = b->c * (int)b->cstep;
                if (0 < (int)uVar9) {
                  pMVar20 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar9 << 2);
                }
                if (0 < (int)uVar21) {
                  pvVar10 = b->data;
                  pMVar20 = (Mat *)0x0;
                  pMVar11 = (Mat *)local_88.data;
                  do {
                    if (0 < (int)uVar8) {
                      uVar25 = 0;
                      do {
                        *(float *)((long)pvVar10 + uVar25 * 4) =
                             *(float *)((long)&pMVar11->data + uVar25 * 4) +
                             *(float *)((long)pvVar10 + uVar25 * 4);
                        uVar25 = uVar25 + 1;
                      } while (uVar22 != uVar25);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pMVar11 = (Mat *)((long)&pMVar11->data +
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     * local_88.cstep);
                  } while (pMVar20 != pMVar15);
                }
LAB_00212226:
                unaff_R14D = 0;
              }
            }
            Mat::~Mat(&local_88);
          }
          bVar16 = false;
        }
        else {
          Mat::create(b,uVar21,sVar2,*(Allocator **)(lVar14 + 8));
          if ((int)uVar21 < 1) goto LAB_00211cfe;
          pvVar10 = a->data;
          sVar2 = a->elemsize;
          sVar3 = a->cstep;
          pvVar24 = b->data;
          pMVar20 = (Mat *)(ulong)uVar26;
          pMVar11 = (Mat *)0x0;
          do {
            fVar28 = 0.0;
            if (0 < (int)uVar26) {
              pMVar12 = (Mat *)0x0;
              do {
                fVar28 = fVar28 + ABS(*(float *)((long)pvVar10 + (long)pMVar12 * 4));
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              } while (pMVar20 != pMVar12);
            }
            *(float *)((long)pvVar24 + (long)pMVar11 * 4) = fVar28;
            pMVar11 = (Mat *)((long)&pMVar11->data + 1);
            pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
          } while (pMVar11 != pMVar15);
LAB_00211cf3:
          bVar16 = false;
          unaff_R14D = 0;
        }
      }
      else {
        Mat::create(b,1,sVar2,*(Allocator **)(lVar14 + 8));
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        Mat::create(&local_88,uVar21,sVar2,*(Allocator **)(lVar14 + 0x10));
        unaff_R14D = -100;
        if (((Mat *)local_88.data != (Mat *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
          if ((int)uVar21 < 1) {
LAB_00211d09:
            fVar28 = 0.0;
          }
          else {
            sVar2 = a->elemsize;
            sVar3 = a->cstep;
            pvVar10 = a->data;
            pMVar20 = (Mat *)(ulong)uVar26;
            pMVar11 = (Mat *)0x0;
            do {
              fVar28 = 0.0;
              if (0 < (int)uVar26) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar28 = fVar28 + ABS(*(float *)((long)pvVar10 + (long)pMVar12 * 4));
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar20 != pMVar12);
              }
              *(float *)((long)(void **)local_88.data + (long)pMVar11 * 4) = fVar28;
              pMVar11 = (Mat *)((long)&pMVar11->data + 1);
              pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
            } while (pMVar11 != pMVar15);
            if ((int)uVar21 < 1) goto LAB_00211d09;
            fVar28 = 0.0;
            pMVar11 = (Mat *)0x0;
            do {
              fVar28 = fVar28 + *(float *)((long)(void **)local_88.data + (long)pMVar11 * 4);
              pMVar11 = (Mat *)((long)&pMVar11->data + 1);
            } while (pMVar15 != pMVar11);
          }
          *(float *)b->data = fVar28;
          unaff_R14D = 0;
        }
        piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pMVar20 = (Mat *)local_88.data;
            if (local_88.allocator == (Allocator *)0x0) {
              if ((Mat *)local_88.data != (Mat *)0x0) {
                free(local_88.data);
              }
            }
            else {
              (*(local_88.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        bVar16 = false;
      }
      goto LAB_0021223f;
    }
  }
  else {
    if (iVar17 == 2) {
      uVar9 = a->w;
      pMVar15 = (Mat *)(ulong)uVar9;
      uVar8 = a->h;
      pMVar11 = (Mat *)(ulong)uVar8;
      bVar16 = !reduce_w;
      if (!bVar16 && reduce_h) {
        local_38 = a;
        Mat::create(b,1,1,sVar2,*(Allocator **)(lVar14 + 8));
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        pMVar20 = pMVar11;
        Mat::create(&local_88,uVar8,sVar2,*(Allocator **)(lVar14 + 0x10));
        a = local_38;
        unaff_R14D = -100;
        if (((Mat *)local_88.data != (Mat *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
          if ((int)uVar8 < 1) {
LAB_00211140:
            fVar28 = 0.0;
          }
          else {
            pvVar10 = local_38->data;
            iVar1 = local_38->w;
            sVar3 = local_38->elemsize;
            pMVar20 = (Mat *)0x0;
            do {
              fVar28 = 0.0;
              if (0 < (int)uVar9) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar28 = fVar28 + ABS(*(float *)((long)pvVar10 + (long)pMVar12 * 4));
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar15 != pMVar12);
              }
              *(float *)((long)(void **)local_88.data + (long)pMVar20 * 4) = fVar28;
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar10 = (void *)((long)pvVar10 + (long)iVar1 * sVar3);
            } while (pMVar20 != pMVar11);
            if ((int)uVar8 < 1) goto LAB_00211140;
            fVar28 = 0.0;
            pMVar15 = (Mat *)0x0;
            do {
              fVar28 = fVar28 + *(float *)((long)(void **)local_88.data + (long)pMVar15 * 4);
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
            } while (pMVar11 != pMVar15);
          }
          *(float *)b->data = fVar28;
          unaff_R14D = 0;
        }
        lVar14 = CONCAT44(in_stack_0000000c,keepdims);
        piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pMVar20 = (Mat *)local_88.data;
            if (local_88.allocator == (Allocator *)0x0) {
              if ((Mat *)local_88.data != (Mat *)0x0) {
                free(local_88.data);
                lVar14 = CONCAT44(in_stack_0000000c,keepdims);
              }
            }
            else {
              (*(local_88.allocator)->_vptr_Allocator[3])();
              lVar14 = CONCAT44(in_stack_0000000c,keepdims);
            }
          }
        }
        bVar16 = false;
      }
      else {
        pMVar20 = (Mat *)(CONCAT71(in_register_00000011,bVar16 || reduce_h) & 0xffffffff);
        if (bVar16 || reduce_h) {
          if (reduce_h && !reduce_w) {
            pMVar20 = pMVar15;
            Mat::create(b,uVar9,1,sVar2,*(Allocator **)(lVar14 + 8));
            uVar21 = b->c * (int)b->cstep;
            if (0 < (int)uVar21) {
              pMVar20 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar21 << 2);
            }
            lVar14 = CONCAT44(in_stack_0000000c,keepdims);
            if (0 < (int)uVar8) {
              iVar1 = a->w;
              sVar3 = a->elemsize;
              pvVar10 = a->data;
              pvVar24 = b->data;
              pMVar20 = (Mat *)0x0;
              do {
                if (0 < (int)uVar9) {
                  pMVar12 = (Mat *)0x0;
                  do {
                    *(float *)((long)pvVar24 + (long)pMVar12 * 4) =
                         ABS(*(float *)((long)pvVar10 + (long)pMVar12 * 4)) +
                         *(float *)((long)pvVar24 + (long)pMVar12 * 4);
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                  } while (pMVar15 != pMVar12);
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                pvVar10 = (void *)((long)pvVar10 + (long)iVar1 * sVar3);
              } while (pMVar20 != pMVar11);
            }
LAB_00211136:
            bVar16 = false;
            unaff_R14D = 0;
          }
          else {
            bVar16 = true;
          }
        }
        else {
          pMVar20 = (Mat *)0x1;
          Mat::create(b,1,uVar8,sVar2,*(Allocator **)(lVar14 + 8));
          if (0 < (int)uVar8) {
            iVar1 = a->w;
            sVar3 = a->elemsize;
            pvVar10 = a->data;
            pvVar24 = b->data;
            pMVar20 = (Mat *)0x0;
            lVar14 = CONCAT44(in_stack_0000000c,keepdims);
            do {
              fVar28 = 0.0;
              if (0 < (int)uVar9) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar28 = fVar28 + ABS(*(float *)((long)pvVar10 + (long)pMVar12 * 4));
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar15 != pMVar12);
              }
              *(float *)((long)pvVar24 + (long)pMVar20 * 4) = fVar28;
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar10 = (void *)((long)pvVar10 + (long)iVar1 * sVar3);
            } while (pMVar20 != pMVar11);
            goto LAB_00211136;
          }
          bVar16 = false;
          unaff_R14D = 0;
          lVar14 = CONCAT44(in_stack_0000000c,keepdims);
        }
      }
      in_register_00000011 = in_register_00000011 & 0xffffff;
      if (!bVar16) goto LAB_00212249;
    }
    else if (iVar17 == 1) {
      iVar17 = a->w;
      pMVar20 = (Mat *)0x1;
      Mat::create(b,1,sVar2,*(Allocator **)(lVar14 + 8));
      if ((long)iVar17 < 1) {
LAB_00210caa:
        fVar28 = 0.0;
      }
      else {
        fVar28 = 0.0;
        lVar14 = 0;
        do {
          fVar28 = fVar28 + ABS(*(float *)((long)a->data + lVar14 * 4));
          lVar14 = lVar14 + 1;
        } while (iVar17 != lVar14);
      }
LAB_00210cad:
      *(float *)b->data = fVar28;
      unaff_R14D = 0;
      goto LAB_00212249;
    }
    if (iVar17 == 3) {
      uVar9 = a->w;
      lVar27 = (long)(int)uVar9;
      uVar8 = a->h;
      uVar22 = (ulong)uVar8;
      uVar21 = a->c;
      pMVar15 = (Mat *)(ulong)uVar21;
      uVar26 = uVar8 * uVar9;
      bVar16 = !reduce_w;
      bVar7 = !reduce_h;
      bVar13 = !reduce_c;
      if ((bVar16 || bVar7) || bVar13) {
        if ((bVar16 || bVar7) || reduce_c) {
          pMVar11 = (Mat *)(ulong)uVar9;
          uVar25 = CONCAT71(in_register_00000011,bVar16 || reduce_h) & 0xffffffff;
          bVar19 = (byte)uVar25 | reduce_c;
          pMVar20 = (Mat *)CONCAT71((int7)(uVar25 >> 8),bVar19);
          if (bVar19 == 0) {
            pMVar20 = (Mat *)0x1;
            Mat::create(b,1,uVar8,uVar21,sVar2,*(Allocator **)(lVar14 + 8));
            if (0 < (int)uVar21) {
              pvVar10 = a->data;
              sVar2 = a->elemsize;
              pvVar24 = b->data;
              pMVar20 = (Mat *)(b->elemsize * b->cstep);
              sVar3 = a->cstep;
              pMVar12 = (Mat *)0x0;
              do {
                if (0 < (int)uVar8) {
                  uVar25 = 0;
                  pvVar23 = pvVar10;
                  do {
                    fVar28 = 0.0;
                    if (0 < (int)uVar9) {
                      pMVar18 = (Mat *)0x0;
                      do {
                        fVar28 = fVar28 + ABS(*(float *)((long)pvVar23 + (long)pMVar18 * 4));
                        pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                      } while (pMVar11 != pMVar18);
                    }
                    *(float *)((long)pvVar24 + uVar25 * 4 + (long)pMVar20 * (long)pMVar12) = fVar28;
                    uVar25 = uVar25 + 1;
                    pvVar23 = (void *)((long)pvVar23 + lVar27 * 4);
                  } while (uVar25 != uVar22);
                }
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
              } while (pMVar12 != pMVar15);
              goto LAB_002116ed;
            }
LAB_002116f8:
            unaff_R14D = 0;
          }
          else {
            if ((bVar16 || reduce_h) || bVar13) {
              if ((bVar7 || reduce_w) || bVar13) {
                if ((reduce_w || reduce_h) || bVar13) {
                  bVar16 = true;
                  if ((!bVar7 && !reduce_w) && !reduce_c) {
                    pMVar20 = pMVar11;
                    Mat::create(b,uVar9,1,uVar21,sVar2,*(Allocator **)(lVar14 + 8));
                    uVar26 = b->c * (int)b->cstep;
                    if (0 < (int)uVar26) {
                      pMVar20 = (Mat *)0x0;
                      memset(b->data,0,(ulong)uVar26 << 2);
                    }
                    if ((int)uVar21 < 1) goto LAB_002116f8;
                    pvVar10 = a->data;
                    sVar2 = a->elemsize;
                    pvVar24 = b->data;
                    pMVar20 = (Mat *)(b->elemsize * b->cstep);
                    sVar3 = a->cstep;
                    pMVar12 = (Mat *)0x0;
                    unaff_R14D = 0;
                    do {
                      if (0 < (int)uVar8) {
                        uVar21 = 0;
                        pvVar23 = pvVar10;
                        do {
                          if (0 < (int)uVar9) {
                            pMVar18 = (Mat *)0x0;
                            do {
                              *(float *)((long)pvVar24 + (long)pMVar18 * 4) =
                                   ABS(*(float *)((long)pvVar23 + (long)pMVar18 * 4)) +
                                   *(float *)((long)pvVar24 + (long)pMVar18 * 4);
                              pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                            } while (pMVar11 != pMVar18);
                          }
                          uVar21 = uVar21 + 1;
                          pvVar23 = (void *)((long)pvVar23 + (long)(int)uVar9 * 4);
                        } while (uVar21 != uVar8);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
                      pvVar24 = (void *)((long)&pMVar20->data + (long)pvVar24);
                      bVar16 = false;
                    } while (pMVar12 != pMVar15);
                  }
                }
                else {
                  Mat::create(b,uVar9,uVar8,1,sVar2,*(Allocator **)(lVar14 + 8));
                  uVar9 = b->c * (int)b->cstep;
                  if (0 < (int)uVar9) {
                    pMVar11 = (Mat *)0x0;
                    memset(b->data,0,(ulong)uVar9 << 2);
                  }
                  pMVar20 = pMVar11;
                  if ((int)uVar21 < 1) goto LAB_002116ed;
                  pvVar10 = a->data;
                  sVar2 = a->elemsize;
                  sVar3 = a->cstep;
                  pvVar24 = b->data;
                  pMVar20 = (Mat *)(ulong)uVar26;
                  pMVar11 = (Mat *)0x0;
                  bVar16 = false;
                  unaff_R14D = 0;
                  do {
                    if (0 < (int)uVar26) {
                      pMVar12 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar24 + (long)pMVar12 * 4) =
                             ABS(*(float *)((long)pvVar10 + (long)pMVar12 * 4)) +
                             *(float *)((long)pvVar24 + (long)pMVar12 * 4);
                        pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      } while (pMVar20 != pMVar12);
                    }
                    pMVar11 = (Mat *)((long)&pMVar11->data + 1);
                    pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
                  } while (pMVar11 != pMVar15);
                }
                goto LAB_0021223f;
              }
              Mat::create(b,uVar9,1,1,sVar2,*(Allocator **)(lVar14 + 8));
              local_88.cstep = 0;
              local_88.data = (Mat *)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88.elemsize._4_4_ = 0;
              local_88.elempack = 0;
              local_88.allocator = (Allocator *)0x0;
              local_88.dims = 0;
              local_88.w = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              pMVar20 = (Mat *)(ulong)uVar9;
              Mat::create(&local_88,uVar9,1,uVar21,sVar2,*(Allocator **)(lVar14 + 0x10));
              unaff_R14D = -100;
              if (((Mat *)local_88.data != (Mat *)0x0) && (local_88.cstep * (long)local_88.c != 0))
              {
                uVar26 = (int)local_88.cstep * local_88.c;
                if (0 < (int)uVar26) {
                  pMVar20 = (Mat *)0x0;
                  memset(local_88.data,0,(ulong)uVar26 << 2);
                }
                if (0 < (int)uVar21) {
                  pvVar10 = a->data;
                  sVar2 = a->elemsize;
                  sVar3 = a->cstep;
                  pMVar12 = (Mat *)0x0;
                  pMVar20 = (Mat *)local_88.data;
                  do {
                    if (0 < (int)uVar8) {
                      uVar26 = 0;
                      pvVar24 = pvVar10;
                      do {
                        if (0 < (int)uVar9) {
                          pMVar18 = (Mat *)0x0;
                          do {
                            *(float *)((long)&pMVar20->data + (long)pMVar18 * 4) =
                                 ABS(*(float *)((long)pvVar24 + (long)pMVar18 * 4)) +
                                 *(float *)((long)&pMVar20->data + (long)pMVar18 * 4);
                            pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                          } while (pMVar11 != pMVar18);
                        }
                        uVar26 = uVar26 + 1;
                        pvVar24 = (void *)((long)pvVar24 + lVar27 * 4);
                      } while (uVar26 != uVar8);
                    }
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
                    pMVar20 = (Mat *)((long)&pMVar20->data +
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     * local_88.cstep);
                  } while (pMVar12 != pMVar15);
                }
                uVar8 = b->c * (int)b->cstep;
                if (0 < (int)uVar8) {
                  pMVar20 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar8 << 2);
                }
                if (0 < (int)uVar21) {
                  pvVar10 = b->data;
                  pMVar20 = (Mat *)0x0;
                  pMVar12 = (Mat *)local_88.data;
                  do {
                    if (0 < (int)uVar9) {
                      pMVar18 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar10 + (long)pMVar18 * 4) =
                             *(float *)((long)&pMVar12->data + (long)pMVar18 * 4) +
                             *(float *)((long)pvVar10 + (long)pMVar18 * 4);
                        pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                      } while (pMVar11 != pMVar18);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pMVar12 = (Mat *)((long)&pMVar12->data +
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     * local_88.cstep);
                  } while (pMVar20 != pMVar15);
                }
                goto LAB_00212085;
              }
            }
            else {
              Mat::create(b,1,uVar8,1,sVar2,*(Allocator **)(lVar14 + 8));
              local_88.cstep = 0;
              local_88.data = (Mat *)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88.elemsize._4_4_ = 0;
              local_88.elempack = 0;
              local_88.allocator = (Allocator *)0x0;
              local_88.dims = 0;
              local_88.w = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              pMVar20 = (Mat *)0x1;
              Mat::create(&local_88,1,uVar8,uVar21,sVar2,*(Allocator **)(lVar14 + 0x10));
              unaff_R14D = -100;
              if (((Mat *)local_88.data != (Mat *)0x0) && (local_88.cstep * (long)local_88.c != 0))
              {
                uVar26 = (int)local_88.cstep * local_88.c;
                if (0 < (int)uVar26) {
                  pMVar20 = (Mat *)0x0;
                  memset(local_88.data,0,(ulong)uVar26 << 2);
                }
                if (0 < (int)uVar21) {
                  pvVar10 = a->data;
                  sVar2 = a->elemsize;
                  pMVar20 = (Mat *)(CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                   * local_88.cstep);
                  sVar3 = a->cstep;
                  pMVar12 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar8) {
                      uVar25 = 0;
                      pvVar24 = pvVar10;
                      do {
                        fVar28 = 0.0;
                        if (0 < (int)uVar9) {
                          pMVar18 = (Mat *)0x0;
                          do {
                            fVar28 = fVar28 + ABS(*(float *)((long)pvVar24 + (long)pMVar18 * 4));
                            pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                          } while (pMVar11 != pMVar18);
                        }
                        *(float *)((long)(void **)local_88.data +
                                  uVar25 * 4 + (long)pMVar20 * (long)pMVar12) = fVar28;
                        uVar25 = uVar25 + 1;
                        pvVar24 = (void *)((long)pvVar24 + lVar27 * 4);
                      } while (uVar25 != uVar22);
                    }
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
                  } while (pMVar12 != pMVar15);
                }
                uVar9 = b->c * (int)b->cstep;
                if (0 < (int)uVar9) {
                  pMVar20 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar9 << 2);
                }
                if (0 < (int)uVar21) {
                  pvVar10 = b->data;
                  pMVar20 = (Mat *)0x0;
                  pMVar11 = (Mat *)local_88.data;
                  do {
                    if (0 < (int)uVar8) {
                      uVar25 = 0;
                      do {
                        *(float *)((long)pvVar10 + uVar25 * 4) =
                             *(float *)((long)&pMVar11->data + uVar25 * 4) +
                             *(float *)((long)pvVar10 + uVar25 * 4);
                        uVar25 = uVar25 + 1;
                      } while (uVar22 != uVar25);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pMVar11 = (Mat *)((long)&pMVar11->data +
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     * local_88.cstep);
                  } while (pMVar20 != pMVar15);
                }
LAB_00212085:
                unaff_R14D = 0;
              }
            }
            Mat::~Mat(&local_88);
          }
          bVar16 = false;
        }
        else {
          pMVar20 = (Mat *)0x1;
          Mat::create(b,1,1,uVar21,sVar2,*(Allocator **)(lVar14 + 8));
          if ((int)uVar21 < 1) goto LAB_002116f8;
          pvVar10 = a->data;
          sVar2 = a->elemsize;
          sVar3 = b->elemsize;
          sVar4 = a->cstep;
          sVar5 = b->cstep;
          pMVar20 = (Mat *)b->data;
          pMVar11 = (Mat *)0x0;
          do {
            fVar28 = 0.0;
            if (0 < (int)uVar26) {
              uVar22 = 0;
              do {
                fVar28 = fVar28 + ABS(*(float *)((long)pvVar10 + uVar22 * 4));
                uVar22 = uVar22 + 1;
              } while (uVar26 != uVar22);
            }
            *(float *)((long)&pMVar20->data + sVar3 * sVar5 * (long)pMVar11) = fVar28;
            pMVar11 = (Mat *)((long)&pMVar11->data + 1);
            pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar4);
          } while (pMVar11 != pMVar15);
LAB_002116ed:
          bVar16 = false;
          unaff_R14D = 0;
        }
      }
      else {
        Mat::create(b,1,1,1,sVar2,*(Allocator **)(lVar14 + 8));
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        pMVar20 = pMVar15;
        Mat::create(&local_88,uVar21,sVar2,*(Allocator **)(lVar14 + 0x10));
        unaff_R14D = -100;
        if (((Mat *)local_88.data != (Mat *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
          if ((int)uVar21 < 1) {
LAB_00211703:
            fVar28 = 0.0;
          }
          else {
            sVar2 = a->elemsize;
            sVar3 = a->cstep;
            pvVar10 = a->data;
            pMVar20 = (Mat *)(ulong)uVar26;
            pMVar11 = (Mat *)0x0;
            do {
              fVar28 = 0.0;
              if (0 < (int)uVar26) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar28 = fVar28 + ABS(*(float *)((long)pvVar10 + (long)pMVar12 * 4));
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar20 != pMVar12);
              }
              *(float *)((long)(void **)local_88.data + (long)pMVar11 * 4) = fVar28;
              pMVar11 = (Mat *)((long)&pMVar11->data + 1);
              pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
            } while (pMVar11 != pMVar15);
            if ((int)uVar21 < 1) goto LAB_00211703;
            fVar28 = 0.0;
            pMVar11 = (Mat *)0x0;
            do {
              fVar28 = fVar28 + *(float *)((long)(void **)local_88.data + (long)pMVar11 * 4);
              pMVar11 = (Mat *)((long)&pMVar11->data + 1);
            } while (pMVar15 != pMVar11);
          }
          *(float *)b->data = fVar28;
          unaff_R14D = 0;
        }
        piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pMVar20 = (Mat *)local_88.data;
            if (local_88.allocator == (Allocator *)0x0) {
              if ((Mat *)local_88.data != (Mat *)0x0) {
                free(local_88.data);
              }
            }
            else {
              (*(local_88.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        bVar16 = false;
      }
LAB_0021223f:
      if (!bVar16) goto LAB_00212249;
    }
  }
  unaff_R14D = 0;
LAB_00212249:
  iVar17 = -100;
  if (unaff_R14D == 0) {
    iVar17 = 0;
    if (1.1920929e-07 < ABS(v0 + -1.0)) {
      reduction_post_process<ncnn::post_process_identity<float>>(b,v0,(Option *)pMVar20);
      iVar17 = 0;
    }
  }
  return iVar17;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret;
    if (keepdims)
        ret = reduction_op_keepdims<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    else
        ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabs(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }
    return ret;
}